

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader_test.cc
# Opt level: O2

void __thiscall
fizplex::MPSReaderTest_WrongRowTypeThrows_Test::TestBody
          (MPSReaderTest_WrongRowTypeThrows_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c8;
  AssertHelper local_c0;
  string local_b8;
  LP local_98;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"./test/wrong_row_type.mps",(allocator<char> *)&sStack_c8);
    MPSReader::read_lp(&local_98,&local_b8);
    LP::~LP(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  testing::Message::Message((Message *)&sStack_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/mpsreader_test.cc"
             ,0x22,
             "Expected: MPSReader::read_lp(\"./test/wrong_row_type.mps\") throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)&sStack_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_c8);
  return;
}

Assistant:

TEST(MPSReaderTest, WrongRowTypeThrows) {
  EXPECT_THROW(MPSReader::read_lp("./test/wrong_row_type.mps"),
               std::runtime_error);
}